

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_logger.cpp
# Opt level: O1

void juzzlin::SimpleLogger::setCustomTimestampFormat(string *customTimestampFormat)

{
  pointer pcVar1;
  long *local_30 [2];
  long local_20 [2];
  
  Impl::m_timestampMode = 7;
  pcVar1 = (customTimestampFormat->_M_dataplus)._M_p;
  local_30[0] = local_20;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_30,pcVar1,pcVar1 + customTimestampFormat->_M_string_length);
  std::__cxx11::string::_M_assign((string *)&Impl::m_customTimestampFormat_abi_cxx11_);
  if (local_30[0] != local_20) {
    operator_delete(local_30[0],local_20[0] + 1);
  }
  return;
}

Assistant:

void SimpleLogger::Impl::setTimestampMode(TimestampMode timestampMode)
{
    m_timestampMode = timestampMode;
}